

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::MatchLiteralNode::AnnotatePass1
          (MatchLiteralNode *this,Compiler *compiler,bool parentNotInLoop,bool parentAtLeastOnce,
          bool parentNotSpeculative,bool parentNotNegated)

{
  Char lc;
  CharCount CVar1;
  CharSet<char16_t> *this_00;
  uint uVar2;
  
  (this->super_Node).features = 0x10;
  CVar1 = this->length;
  (this->super_Node).thisConsumes.upper = CVar1;
  (this->super_Node).thisConsumes.lower = CVar1;
  uVar2 = 0;
  this_00 = (CharSet<char16_t> *)new<Memory::ArenaAllocator>(0x28,compiler->ctAllocator,0x366bee);
  CharSet<char16_t>::CharSet(this_00);
  (this->super_Node).firstSet = this_00;
  do {
    lc = (compiler->program->rep).insts.litbuf.ptr[this->offset + uVar2];
    CharSet<char16_t>::SetRange((this->super_Node).firstSet,compiler->ctAllocator,lc,lc);
    if (2 < uVar2) break;
    uVar2 = uVar2 + 1;
  } while (this->isEquivClass != false);
  *(uint *)&(this->super_Node).field_0xc =
       (*(uint *)&(this->super_Node).field_0xc & 0xffffc3cc) +
       ((uint)parentNotInLoop << 10 | (uint)parentAtLeastOnce << 0xb |
        (uint)parentNotSpeculative << 0xc | (uint)parentNotNegated << 0xd) + 0x31;
  return;
}

Assistant:

void MatchLiteralNode::AnnotatePass1(Compiler& compiler, bool parentNotInLoop, bool parentAtLeastOnce, bool parentNotSpeculative, bool parentNotNegated)
    {
        features = HasMatchLiteral;
        thisConsumes.Exact(length);
        firstSet = Anew(compiler.ctAllocator, UnicodeCharSet);
        for (int i = 0; i < (isEquivClass ? CaseInsensitive::EquivClassSize : 1); i++)
            firstSet->Set(compiler.ctAllocator, compiler.program->rep.insts.litbuf[offset + i]);
        isFirstExact = true;
        isThisIrrefutable = false;
        isThisWillNotProgress = true;
        isThisWillNotRegress = true;
        isNotInLoop = parentNotInLoop;
        isAtLeastOnce = parentAtLeastOnce;
        isNotSpeculative = parentNotSpeculative;
        isNotNegated = parentNotNegated;
    }